

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Expression * call(void)

{
  int iVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *ex;
  Expression *expr;
  
  ex = primary();
  while( true ) {
    while (iVar1 = match(TOKEN_LEFT_PAREN), iVar1 != 0) {
      ex = getCall(ex);
    }
    iVar1 = match(TOKEN_DOT);
    if (iVar1 == 0) break;
    pEVar2 = newExpression();
    pEVar2->type = EXPR_REFERENCE;
    iVar1 = presentLine();
    (pEVar2->field_1).binary.line = iVar1;
    (pEVar2->field_1).binary.left = ex;
    pEVar3 = call();
    (pEVar2->field_1).referenceExpression.member = pEVar3;
    ex = pEVar2;
  }
  return ex;
}

Assistant:

static Expression* call(){
    Expression* expr = primary();
    while(true){
        if(match(TOKEN_LEFT_PAREN)){
            expr  = getCall(expr);
        }
        else if(match(TOKEN_DOT)){
            Expression *ex = newExpression();
            ex->type = EXPR_REFERENCE;
            ex->referenceExpression.line = presentLine();
            ex->referenceExpression.containerName = expr;
            ex->referenceExpression.member = call();
            expr = ex;
        }
        else
            break;
    }
    return expr;
}